

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::anon_unknown_1::UserDefinedIOCase::IOBlock::glslTraverseBasicTypeArray
          (string *__return_storage_ptr__,IOBlock *this,int numArrayElements,int indentationDepth,
          BasicTypeVisitFunc visit)

{
  long lVar1;
  long lVar2;
  int numArrayElements_local;
  BasicTypeVisitFunc local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string indentation;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  numArrayElements_local = numArrayElements;
  local_f8 = visit;
  if (numArrayElements < 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    lVar2 = 0;
    for (lVar1 = 0;
        lVar1 < (int)(((long)(this->m_members).
                             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_members).
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x38); lVar1 = lVar1 + 1) {
      std::operator+(&local_b0,&this->m_interfaceName,"[gl_InvocationID].");
      std::operator+(&local_f0,&local_b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(((this->m_members).
                               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                               ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                     lVar2));
      glslTraverseBasicTypes
                (&indentation,&local_f0,
                 (VarType *)
                 ((long)&(((this->m_members).
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                           ._M_impl.super__Vector_impl_data._M_start)->type).m_type + lVar2),0,
                 indentationDepth,local_f8);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&indentation);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_b0);
      lVar2 = lVar2 + 0x38;
    }
  }
  else {
    indentation._M_dataplus._M_p = (pointer)&indentation.field_2;
    std::__cxx11::string::_M_construct((ulong)&indentation,(char)indentationDepth);
    std::operator+(&local_50,&indentation,"for (int i0 = 0; i0 < ");
    de::toString<int>(&local_70,&numArrayElements_local);
    std::operator+(&local_90,&local_50,&local_70);
    std::operator+(&local_b0,&local_90,"; i0++)\n");
    std::operator+(&local_f0,&local_b0,&indentation);
    std::operator+(__return_storage_ptr__,&local_f0,"{\n");
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    lVar1 = 0;
    for (lVar2 = 0;
        lVar2 < (int)(((long)(this->m_members).
                             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_members).
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x38); lVar2 = lVar2 + 1) {
      std::operator+(&local_90,&this->m_interfaceName,"[i0].");
      std::operator+(&local_b0,&local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(((this->m_members).
                               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                               ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                     lVar1));
      glslTraverseBasicTypes
                (&local_f0,&local_b0,
                 (VarType *)
                 ((long)&(((this->m_members).
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                           ._M_impl.super__Vector_impl_data._M_start)->type).m_type + lVar1),1,
                 indentationDepth + 1,local_f8);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      lVar1 = lVar1 + 0x38;
    }
    std::operator+(&local_f0,&indentation,"}\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&indentation);
  }
  return __return_storage_ptr__;
}

Assistant:

string UserDefinedIOCase::IOBlock::glslTraverseBasicTypeArray (int numArrayElements, int indentationDepth, BasicTypeVisitFunc visit) const
{
	if (numArrayElements >= 0)
	{
		const string	indentation			= string(indentationDepth, '\t');
		string			result				= indentation + "for (int i0 = 0; i0 < " + de::toString(numArrayElements) + "; i0++)\n" +
											  indentation + "{\n";
		for (int i = 0; i < (int)m_members.size(); i++)
			result += UserDefinedIOCase::glslTraverseBasicTypes(m_interfaceName + "[i0]." + m_members[i].name, m_members[i].type, 1, indentationDepth+1, visit);
		result += indentation + "}\n";
		return result;
	}
	else
	{
		string result;
		for (int i = 0; i < (int)m_members.size(); i++)
			result += UserDefinedIOCase::glslTraverseBasicTypes(m_interfaceName + "[gl_InvocationID]." + m_members[i].name, m_members[i].type, 0, indentationDepth, visit);
		return result;
	}
}